

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<ScenePreprocessorTest_testMeshPreprocessingNeg_Test>::CreateTest
          (TestFactoryImpl<ScenePreprocessorTest_testMeshPreprocessingNeg_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<ScenePreprocessorTest_testMeshPreprocessingNeg_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x20);
  ScenePreprocessorTest_testMeshPreprocessingNeg_Test::
  ScenePreprocessorTest_testMeshPreprocessingNeg_Test
            ((ScenePreprocessorTest_testMeshPreprocessingNeg_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }